

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

void write_int32(buffer *b,int32_t v)

{
  int iVar1;
  uint32_t uv;
  int32_t v_local;
  buffer *b_local;
  
  buffer_reserve(b,4);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)v;
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 8);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x10);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x18);
  return;
}

Assistant:

static inline void
write_int32(struct buffer *b, int32_t v) {
	uint32_t uv = (uint32_t)v;
	buffer_reserve(b,4);
	b->ptr[b->size++] = uv & 0xff;
	b->ptr[b->size++] = (uv >> 8)&0xff;
	b->ptr[b->size++] = (uv >> 16)&0xff;
	b->ptr[b->size++] = (uv >> 24)&0xff;
}